

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

void flatbuffers::(anonymous_namespace)::
     SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
               (Offset<flatbuffers::Table> *begin,Offset<flatbuffers::Table> *end,size_t width,
               anon_class_8_1_ba1d59bf comparator,
               _func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *swapper)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ushort *puVar6;
  int *piVar7;
  uint8_t *a;
  anon_unknown_0 *this;
  Offset<flatbuffers::Table> *b;
  Offset<flatbuffers::Table> *a_00;
  
  lVar3 = -(long)begin;
  while (4 < (long)&end->o + lVar3) {
    a_00 = begin + 1;
    b = end;
    if (a_00 < end) {
      do {
        uVar1 = *(ushort *)(width + 0x108);
        uVar5 = (ulong)begin->o;
        puVar6 = (ushort *)((long)begin + (uVar5 - (long)*(int *)((long)&begin->o + uVar5)));
        if ((uVar1 < *puVar6) && (uVar2 = *(ushort *)((long)puVar6 + (ulong)uVar1), uVar2 != 0)) {
          this = (anon_unknown_0 *)((long)&begin->o + uVar2 + uVar5);
        }
        else {
          this = (anon_unknown_0 *)0x0;
        }
        piVar7 = (int *)((long)&a_00->o + (ulong)a_00->o);
        if ((uVar1 < *(ushort *)((long)piVar7 - (long)*piVar7)) &&
           (uVar1 = *(ushort *)((long)piVar7 + ((ulong)uVar1 - (long)*piVar7)), uVar1 != 0)) {
          a = (uint8_t *)((long)piVar7 + (ulong)uVar1);
        }
        else {
          a = (uint8_t *)0x0;
        }
        comparator.key = *(FieldDef **)(width + 0xe8);
        bVar4 = anon_unknown_0::CompareSerializedScalars
                          (this,a,(uint8_t *)(ulong)*(uint *)(width + 200),comparator.key);
        if (bVar4) {
          b = b + -1;
          anon_unknown_0::SwapSerializedTables(a_00,b);
        }
        else {
          a_00 = a_00 + 1;
        }
      } while (a_00 < b);
    }
    anon_unknown_0::SwapSerializedTables(begin,a_00 + -1);
    SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
              (begin,a_00 + -1,width,comparator,swapper);
    begin = b;
    lVar3 = -(long)b;
  }
  return;
}

Assistant:

static void SimpleQsort(T *begin, T *end, size_t width, F comparator,
                        S swapper) {
  if (end - begin <= static_cast<ptrdiff_t>(width)) return;
  auto l = begin + width;
  auto r = end;
  while (l < r) {
    if (comparator(begin, l)) {
      r -= width;
      swapper(l, r);
    } else {
      l += width;
    }
  }
  l -= width;
  swapper(begin, l);
  SimpleQsort(begin, l, width, comparator, swapper);
  SimpleQsort(r, end, width, comparator, swapper);
}